

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_lock.h
# Opt level: O0

void absl::lts_20240722::flags_internal::SequenceLock::RelaxedCopyToAtomic
               (atomic<unsigned_long> *dst,void *src,size_t size)

{
  void *pvVar1;
  undefined8 local_78;
  uint64_t word_1;
  uint64_t word;
  char *src_byte;
  size_t size_local;
  void *src_local;
  atomic<unsigned_long> *dst_local;
  int local_3c;
  memory_order __b_1;
  void *local_30;
  uint64_t local_28;
  memory_order local_20;
  int local_1c;
  memory_order __b;
  void *local_10;
  
  word = (uint64_t)src;
  size_local = (size_t)src;
  src_local = dst;
  for (src_byte = (char *)size; pvVar1 = src_local, (char *)0x7 < src_byte; src_byte = src_byte + -8
      ) {
    word_1 = *(uint64_t *)word;
    local_10 = src_local;
    local_1c = 0;
    ___b = word_1;
    local_20 = std::operator&(memory_order_relaxed,__memory_order_mask);
    local_28 = ___b;
    if (local_1c == 3) {
      *(uint64_t *)pvVar1 = ___b;
    }
    else if (local_1c == 5) {
      LOCK();
      *(uint64_t *)pvVar1 = ___b;
      UNLOCK();
    }
    else {
      *(uint64_t *)pvVar1 = ___b;
    }
    word = word + 8;
    src_local = (void *)((long)src_local + 8);
  }
  if (src_byte != (char *)0x0) {
    local_78 = 0;
    memcpy(&local_78,(void *)word,(size_t)src_byte);
    pvVar1 = src_local;
    local_30 = src_local;
    ___b_1 = local_78;
    local_3c = 0;
    std::operator&(memory_order_relaxed,__memory_order_mask);
    if (local_3c == 3) {
      *(undefined8 *)pvVar1 = ___b_1;
    }
    else if (local_3c == 5) {
      LOCK();
      *(undefined8 *)pvVar1 = ___b_1;
      UNLOCK();
    }
    else {
      *(undefined8 *)pvVar1 = ___b_1;
    }
  }
  return;
}

Assistant:

static void RelaxedCopyToAtomic(std::atomic<uint64_t>* dst, const void* src,
                                  size_t size) {
    const char* src_byte = static_cast<const char*>(src);
    while (size >= sizeof(uint64_t)) {
      uint64_t word;
      std::memcpy(&word, src_byte, sizeof(word));
      dst->store(word, std::memory_order_relaxed);
      src_byte += sizeof(word);
      dst++;
      size -= sizeof(word);
    }
    if (size > 0) {
      uint64_t word = 0;
      std::memcpy(&word, src_byte, size);
      dst->store(word, std::memory_order_relaxed);
    }
  }